

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::checkRuntimeSizable(TParseContext *this,TSourceLoc *loc,TIntermTyped *base)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  TIntermOperator *this_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermConstantUnion *this_01;
  TConstUnionArray *this_02;
  TConstUnion *this_03;
  undefined4 extraout_var_04;
  long *plVar6;
  TType *this_04;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_05;
  size_type sVar7;
  undefined4 extraout_var_05;
  TQualifier *this_06;
  int memberCount;
  int index;
  TIntermBinary *binary;
  TIntermTyped *base_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  undefined4 extraout_var_01;
  
  bVar1 = isRuntimeLength(this,base);
  if (bVar1) {
    return;
  }
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
  if (((uint)(*(ulong *)(lVar5 + 8) >> 7) & 0x1ff) == 0x47) {
    return;
  }
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))();
  if (((uint)*(undefined8 *)(lVar5 + 8) & 0x7f) == 6) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])();
    this_00 = (TIntermOperator *)CONCAT44(extraout_var_01,iVar2);
    if ((this_00 != (TIntermOperator *)0x0) &&
       (TVar3 = TIntermOperator::getOp(this_00), TVar3 == EOpIndexDirectStruct)) {
      iVar2 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      bVar1 = TIntermTyped::isReference((TIntermTyped *)CONCAT44(extraout_var_02,iVar2));
      if (bVar1) {
        iVar2 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
        this_01 = (TIntermConstantUnion *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x28))();
        this_02 = TIntermConstantUnion::getConstArray(this_01);
        this_03 = TConstUnionArray::operator[](this_02,0);
        iVar2 = TConstUnion::getIConst(this_03);
        iVar4 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0xf0))();
        this_04 = (TType *)(**(code **)(*plVar6 + 0xa8))();
        this_05 = &TType::getStruct(this_04)->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (this_05);
        if (iVar2 == (int)sVar7 + -1) {
          return;
        }
      }
    }
  }
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])();
  if ((((iVar2 == 0xe) ||
       (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 0x11)) ||
      (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 0x13)) ||
     (iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 0x14)) {
LAB_00680912:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
              (this,loc,1,&E_GL_EXT_nonuniform_qualifier,"variable index");
  }
  else {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x20])();
    if (iVar2 == 0x10) {
      iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      this_06 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x58))();
      bVar1 = TQualifier::isUniformOrBuffer(this_06);
      if (bVar1) goto LAB_00680912;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"","[",
               "array must be redeclared with a size before being indexed with a variable");
  }
  return;
}

Assistant:

void TParseContext::checkRuntimeSizable(const TSourceLoc& loc, const TIntermTyped& base)
{
    // runtime length implies runtime sizeable, so no problem
    if (isRuntimeLength(base))
        return;

    if (base.getType().getQualifier().builtIn == EbvSampleMask)
        return;

    // Check for last member of a bufferreference type, which is runtime sizeable
    // but doesn't support runtime length
    if (base.getType().getQualifier().storage == EvqBuffer) {
        const TIntermBinary* binary = base.getAsBinaryNode();
        if (binary != nullptr &&
            binary->getOp() == EOpIndexDirectStruct &&
            binary->getLeft()->isReference()) {

            const int index = binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
            const int memberCount = (int)binary->getLeft()->getType().getReferentType()->getStruct()->size();
            if (index == memberCount - 1)
                return;
        }
    }

    // check for additional things allowed by GL_EXT_nonuniform_qualifier
    if (base.getBasicType() == EbtSampler || base.getBasicType() == EbtAccStruct || base.getBasicType() == EbtRayQuery ||
        base.getBasicType() == EbtHitObjectNV || (base.getBasicType() == EbtBlock && base.getType().getQualifier().isUniformOrBuffer()))
        requireExtensions(loc, 1, &E_GL_EXT_nonuniform_qualifier, "variable index");
    else
        error(loc, "", "[", "array must be redeclared with a size before being indexed with a variable");
}